

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzerResults.cpp
# Opt level: O0

string * GetInputData_abi_cxx11_(U8 data1,U8 data2)

{
  byte in_DL;
  char *pcVar1;
  undefined7 in_register_00000039;
  string *this;
  char *local_40;
  U8 data2_local;
  U8 data1_local;
  string *retVal;
  
  this = (string *)CONCAT71(in_register_00000039,data1);
  std::__cxx11::string::string(this);
  pcVar1 = "Data";
  if ((data2 & 1) != 0) {
    pcVar1 = "Constant";
  }
  std::__cxx11::string::operator+=(this,pcVar1);
  std::__cxx11::string::operator+=(this,',');
  pcVar1 = "Array";
  if ((data2 & 2) != 0) {
    pcVar1 = "Variable";
  }
  std::__cxx11::string::operator+=(this,pcVar1);
  std::__cxx11::string::operator+=(this,',');
  if ((data2 & 4) == 0) {
    local_40 = "Absolute";
  }
  else {
    local_40 = "Relative";
  }
  std::__cxx11::string::operator+=(this,local_40);
  std::__cxx11::string::operator+=(this,',');
  pcVar1 = "No wrap";
  if ((data2 & 8) != 0) {
    pcVar1 = "Wrap";
  }
  std::__cxx11::string::operator+=(this,pcVar1);
  std::__cxx11::string::operator+=(this,',');
  pcVar1 = "Linear";
  if ((data2 & 0x10) != 0) {
    pcVar1 = "Non Linear";
  }
  std::__cxx11::string::operator+=(this,pcVar1);
  std::__cxx11::string::operator+=(this,',');
  pcVar1 = "Preferred State";
  if ((data2 & 0x20) != 0) {
    pcVar1 = "No Preferred";
  }
  std::__cxx11::string::operator+=(this,pcVar1);
  std::__cxx11::string::operator+=(this,',');
  pcVar1 = "No Null position";
  if ((data2 & 0x40) != 0) {
    pcVar1 = "Null State";
  }
  std::__cxx11::string::operator+=(this,pcVar1);
  std::__cxx11::string::operator+=(this,',');
  pcVar1 = "Bit Field";
  if ((in_DL & 1) != 0) {
    pcVar1 = "Buffered Bytes";
  }
  std::__cxx11::string::operator+=(this,pcVar1);
  return this;
}

Assistant:

std::string GetInputData( U8 data1, U8 data2 )
{
    std::string retVal;

    retVal += data1 & 0x01 ? "Constant" : "Data";
    retVal += ',';
    retVal += data1 & 0x02 ? "Variable" : "Array";
    retVal += ',';
    retVal += data1 & 0x04 ? "Relative" : "Absolute";
    retVal += ',';
    retVal += data1 & 0x08 ? "Wrap" : "No wrap";
    retVal += ',';
    retVal += data1 & 0x10 ? "Non Linear" : "Linear";
    retVal += ',';
    retVal += data1 & 0x20 ? "No Preferred" : "Preferred State";
    retVal += ',';
    retVal += data1 & 0x40 ? "Null State" : "No Null position";
    retVal += ',';

    retVal += data2 & 0x01 ? "Buffered Bytes" : "Bit Field";

    return retVal;
}